

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp_json_serializer.cpp
# Opt level: O2

bool __thiscall
dap::json::JsonCppSerializer::object
          (JsonCppSerializer *this,function<bool_(dap::FieldSerializer_*)> *cb)

{
  bool bVar1;
  FS fs;
  
  Json::Value::Value((Value *)&fs,objectValue);
  Json::Value::operator=(this->json,(Value *)&fs);
  Json::Value::~Value((Value *)&fs);
  fs.json = this->json;
  fs.super_FieldSerializer._vptr_FieldSerializer = (_func_int **)&PTR__FieldSerializer_009477b0;
  bVar1 = std::function<bool_(dap::FieldSerializer_*)>::operator()(cb,&fs.super_FieldSerializer);
  return bVar1;
}

Assistant:

bool JsonCppSerializer::object(
    const std::function<bool(dap::FieldSerializer*)>& cb) {
  struct FS : public FieldSerializer {
    Json::Value* const json;

    FS(Json::Value* json) : json(json) {}
    bool field(const std::string& name, const SerializeFunc& cb) override {
      JsonCppSerializer s(&(*json)[name]);
      auto res = cb(&s);
      if (s.removed) {
        json->removeMember(name);
      }
      return res;
    }
  };

  *json = Json::Value(Json::objectValue);
  FS fs{json};
  return cb(&fs);
}